

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
ins_ekf::InsEkf::GetStates
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,InsEkf *this)

{
  Scalar *__x;
  CoeffReturnType pdVar1;
  int i_1;
  int i;
  long lVar2;
  Vector3d orientation;
  Vector3d VStack_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  QuatToRPY(&VStack_38,&this->orientation_);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    __x = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)&VStack_38,lVar2);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,__x);
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)&this->position_
                        ,lVar2);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,pdVar1);
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)&this->velocity_
                        ,lVar2);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,pdVar1);
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)&this->bias_g_,
                        lVar2);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,pdVar1);
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)&this->bias_a_,
                        lVar2);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,pdVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> InsEkf::GetStates() const {

        std::vector<double> states;
        Eigen::Vector3d orientation = QuatToRPY(orientation_);

        for(auto i = 0; i < 3; ++i)
            states.push_back(orientation[i]);
        for(auto i = 0; i < 3; ++i)
            states.push_back(position_[i]);
        for(auto i = 0; i < 3; ++i)
            states.push_back(velocity_[i]);
        for(auto i = 0; i < 3; ++i)
            states.push_back(bias_g_[i]);
        for(auto i = 0; i < 3; ++i)
            states.push_back(bias_a_[i]);

        return states;
    }